

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

FeatureMask
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependency_mask(Feature feature)

{
  FeatureMask FVar1;
  FeatureVector local_48;
  Feature local_c;
  Feature feature_local;
  
  local_c = feature;
  get_feature_dependencies(&local_48,feature);
  FVar1 = build_mask(&local_48);
  SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::~SmallVector
            (&local_48);
  return FVar1;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::FeatureMask
CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependency_mask(Feature feature)
{
	return build_mask(get_feature_dependencies(feature));
}